

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

void __thiscall ON_PolyCurve::DestroyRuntimeCache(ON_PolyCurve *this,bool bDelete)

{
  ON_PolyCurve *pOVar1;
  int iVar2;
  ON_Curve **ppOVar3;
  undefined8 extraout_RDX;
  ON_Curve *segment_curve;
  int local_18;
  int count;
  int i;
  bool bDelete_local;
  ON_PolyCurve *this_local;
  
  ON_Curve::DestroyRuntimeCache(&this->super_ON_Curve,bDelete);
  iVar2 = ON_SimpleArray<ON_Curve_*>::Count(&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>);
  for (local_18 = 0; local_18 < iVar2; local_18 = local_18 + 1) {
    ppOVar3 = ON_SimpleArray<ON_Curve_*>::operator[]
                        (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,local_18);
    pOVar1 = (ON_PolyCurve *)*ppOVar3;
    if ((pOVar1 != (ON_PolyCurve *)0x0) && (this != pOVar1)) {
      (*(pOVar1->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x17])
                (pOVar1,(ulong)bDelete,extraout_RDX,bDelete);
    }
  }
  return;
}

Assistant:

void ON_PolyCurve::DestroyRuntimeCache( bool bDelete )
{
  ON_Curve::DestroyRuntimeCache(bDelete);
  int i, count = m_segment.Count();
  for ( i = 0; i < count; i++ )
  {
    ON_Curve* segment_curve = m_segment[i];
    if ( 0 != segment_curve && this != segment_curve )
      segment_curve->DestroyRuntimeCache(bDelete);
  }
}